

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bandwidth_estimator.c
# Opt level: O1

int WebRtcIsac_GetNewFrameLength(double bottle_neck,int current_framesamples)

{
  int new_framesamples;
  
  if (current_framesamples == 0x3c0) {
    current_framesamples = 0x3c0;
    if (27000.0 <= bottle_neck) {
      return 0x1e0;
    }
  }
  else if (current_framesamples == 0x1e0) {
    current_framesamples = 0x3c0;
    if ((18000.0 <= bottle_neck) && (current_framesamples = 0x1e0, 1000000.0 < bottle_neck)) {
      return 0x140;
    }
  }
  else if ((current_framesamples == 0x140) && (current_framesamples = 0x140, bottle_neck < 20000.0))
  {
    return 0x1e0;
  }
  return current_framesamples;
}

Assistant:

int WebRtcIsac_GetNewFrameLength(
    double bottle_neck,
    int    current_framesamples)
{
  int new_framesamples;

  const int Thld_20_30 = 20000;

  //const int Thld_30_20 = 30000;
  const int Thld_30_20 = 1000000;   // disable 20 ms frames

  const int Thld_30_60 = 18000;
  //const int Thld_30_60 = 0;      // disable 60 ms frames

  const int Thld_60_30 = 27000;


  new_framesamples = current_framesamples;

  /* find new framelength */
  switch(current_framesamples) {
    case 320:
      if (bottle_neck < Thld_20_30)
        new_framesamples = 480;
      break;
    case 480:
      if (bottle_neck < Thld_30_60)
        new_framesamples = 960;
      else if (bottle_neck > Thld_30_20)
        new_framesamples = 320;
      break;
    case 960:
      if (bottle_neck >= Thld_60_30)
        new_framesamples = 480;
      break;
  }

  return new_framesamples;
}